

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void Log::setDevice(Device device)

{
  Mutex::lock(&_Log::mutex);
  if (_Log::device != device) {
    if (_Log::device == syslog) {
      closelog();
    }
    _Log::device = device;
    if (device == syslog) {
      openlog((char *)0x0,0xb,0x18);
    }
  }
  Mutex::unlock(&_Log::mutex);
  return;
}

Assistant:

void Log::setDevice(Device device)
{
  Mutex::Guard guard(_Log::mutex);
  if(_Log::device != device)
  {
#ifndef _WIN32
    if(_Log::device == Log::syslog)
      ::closelog();
#endif
    _Log::device = device;
#ifndef _WIN32
    if(device == Log::syslog)
      ::openlog(NULL, LOG_CONS|LOG_NDELAY|LOG_PID, LOG_DAEMON);
#endif
  }
}